

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryBase.hpp
# Opt level: O0

void __thiscall
Diligent::QueryBase<Diligent::EngineVkImplTraits>::CheckQueryDataPtr
          (QueryBase<Diligent::EngineVkImplTraits> *this,void *pData,Uint32 DataSize)

{
  Char *pCVar1;
  char (*in_R8) [27];
  char (*in_stack_fffffffffffffe28) [56];
  undefined1 local_178 [8];
  string msg_8;
  undefined1 local_150 [8];
  string msg_7;
  undefined1 local_128 [8];
  string msg_6;
  undefined1 local_100 [8];
  string msg_5;
  undefined1 local_d8 [8];
  string msg_4;
  undefined1 local_b0 [8];
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  Uint32 DataSize_local;
  void *pData_local;
  QueryBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = DataSize;
  if (this->m_State != Ended) {
    FormatString<char[34],char_const*,char[27]>
              ((string *)local_40,(Diligent *)"Attempting to get data of query \'",
               (char (*) [34])
               &(this->
                super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                ).m_Desc,(char **)"\' that has not been ended.",in_R8);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"CheckQueryDataPtr",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
               ,0xac);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (pData != (void *)0x0) {
    if (*pData != (this->
                  super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                  ).m_Desc.Type) {
      FormatString<char[37]>
                ((string *)((long)&msg_2.field_2 + 8),
                 (char (*) [37])"Incorrect query data structure type.");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"CheckQueryDataPtr",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0xb0);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    switch((this->
           super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
           ).m_Desc.Type) {
    case QUERY_TYPE_UNDEFINED:
      FormatString<char[36]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (char (*) [36])"Undefined query type is unexpected.");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"CheckQueryDataPtr",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0xb6);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      break;
    case QUERY_TYPE_OCCLUSION:
      if (msg.field_2._12_4_ != 0x10) {
        msg_4.field_2._8_8_ = 0x10;
        FormatString<char[25],unsigned_int,char[17],unsigned_long,char[47]>
                  ((string *)local_b0,(Diligent *)"The size of query data (",
                   (char (*) [25])((long)&msg.field_2 + 0xc),(uint *)") is incorrect: ",
                   (char (*) [17])((long)&msg_4.field_2 + 8),
                   (unsigned_long *)" (aka sizeof(QueryDataOcclusion)) is expected.",
                   (char (*) [47])in_stack_fffffffffffffe28);
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"CheckQueryDataPtr",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                   ,0xbb);
        std::__cxx11::string::~string((string *)local_b0);
      }
      break;
    case QUERY_TYPE_BINARY_OCCLUSION:
      if (msg.field_2._12_4_ != 8) {
        msg_5.field_2._8_8_ = 8;
        FormatString<char[25],unsigned_int,char[17],unsigned_long,char[53]>
                  ((string *)local_d8,(Diligent *)"The size of query data (",
                   (char (*) [25])((long)&msg.field_2 + 0xc),(uint *)") is incorrect: ",
                   (char (*) [17])((long)&msg_5.field_2 + 8),
                   (unsigned_long *)" (aka sizeof(QueryDataBinaryOcclusion)) is expected.",
                   (char (*) [53])in_stack_fffffffffffffe28);
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"CheckQueryDataPtr",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                   ,0xc0);
        std::__cxx11::string::~string((string *)local_d8);
      }
      break;
    case QUERY_TYPE_TIMESTAMP:
      if (msg.field_2._12_4_ != 0x18) {
        msg_6.field_2._8_8_ = 0x18;
        FormatString<char[25],unsigned_int,char[17],unsigned_long,char[47]>
                  ((string *)local_100,(Diligent *)"The size of query data (",
                   (char (*) [25])((long)&msg.field_2 + 0xc),(uint *)") is incorrect: ",
                   (char (*) [17])((long)&msg_6.field_2 + 8),
                   (unsigned_long *)" (aka sizeof(QueryDataTimestamp)) is expected.",
                   (char (*) [47])in_stack_fffffffffffffe28);
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"CheckQueryDataPtr",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                   ,0xc5);
        std::__cxx11::string::~string((string *)local_100);
      }
      break;
    case QUERY_TYPE_PIPELINE_STATISTICS:
      if (msg.field_2._12_4_ != 0x60) {
        msg_7.field_2._8_8_ = 0x60;
        FormatString<char[25],unsigned_int,char[17],unsigned_long,char[56]>
                  ((string *)local_128,(Diligent *)"The size of query data (",
                   (char (*) [25])((long)&msg.field_2 + 0xc),(uint *)") is incorrect: ",
                   (char (*) [17])((long)&msg_7.field_2 + 8),
                   (unsigned_long *)" (aka sizeof(QueryDataPipelineStatistics)) is expected.",
                   in_stack_fffffffffffffe28);
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"CheckQueryDataPtr",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                   ,0xca);
        std::__cxx11::string::~string((string *)local_128);
      }
      break;
    case QUERY_TYPE_DURATION:
      if (msg.field_2._12_4_ != 0x18) {
        msg_8.field_2._8_8_ = 0x18;
        FormatString<char[25],unsigned_int,char[17],unsigned_long,char[46]>
                  ((string *)local_150,(Diligent *)"The size of query data (",
                   (char (*) [25])((long)&msg.field_2 + 0xc),(uint *)") is incorrect: ",
                   (char (*) [17])((long)&msg_8.field_2 + 8),
                   (unsigned_long *)" (aka sizeof(QueryDataDuration)) is expected.",
                   (char (*) [46])in_stack_fffffffffffffe28);
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"CheckQueryDataPtr",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                   ,0xcf);
        std::__cxx11::string::~string((string *)local_150);
      }
      break;
    default:
      FormatString<char[23]>((string *)local_178,(char (*) [23])"Unexpected query type.");
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"CheckQueryDataPtr",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/QueryBase.hpp"
                 ,0xd3);
      std::__cxx11::string::~string((string *)local_178);
    }
  }
  return;
}

Assistant:

void CheckQueryDataPtr(void* pData, Uint32 DataSize)
    {
        DEV_CHECK_ERR(m_State == QueryState::Ended,
                      "Attempting to get data of query '", this->m_Desc.Name, "' that has not been ended.");

        if (pData != nullptr)
        {
            DEV_CHECK_ERR(*reinterpret_cast<QUERY_TYPE*>(pData) == this->m_Desc.Type, "Incorrect query data structure type.");

            static_assert(QUERY_TYPE_NUM_TYPES == 6, "Not all QUERY_TYPE enum values are handled below.");
            switch (this->m_Desc.Type)
            {
                case QUERY_TYPE_UNDEFINED:
                    UNEXPECTED("Undefined query type is unexpected.");
                    break;

                case QUERY_TYPE_OCCLUSION:
                    DEV_CHECK_ERR(DataSize == sizeof(QueryDataOcclusion),
                                  "The size of query data (", DataSize, ") is incorrect: ", sizeof(QueryDataOcclusion), " (aka sizeof(QueryDataOcclusion)) is expected.");
                    break;

                case QUERY_TYPE_BINARY_OCCLUSION:
                    DEV_CHECK_ERR(DataSize == sizeof(QueryDataBinaryOcclusion),
                                  "The size of query data (", DataSize, ") is incorrect: ", sizeof(QueryDataBinaryOcclusion), " (aka sizeof(QueryDataBinaryOcclusion)) is expected.");
                    break;

                case QUERY_TYPE_TIMESTAMP:
                    DEV_CHECK_ERR(DataSize == sizeof(QueryDataTimestamp),
                                  "The size of query data (", DataSize, ") is incorrect: ", sizeof(QueryDataTimestamp), " (aka sizeof(QueryDataTimestamp)) is expected.");
                    break;

                case QUERY_TYPE_PIPELINE_STATISTICS:
                    DEV_CHECK_ERR(DataSize == sizeof(QueryDataPipelineStatistics),
                                  "The size of query data (", DataSize, ") is incorrect: ", sizeof(QueryDataPipelineStatistics), " (aka sizeof(QueryDataPipelineStatistics)) is expected.");
                    break;

                case QUERY_TYPE_DURATION:
                    DEV_CHECK_ERR(DataSize == sizeof(QueryDataDuration),
                                  "The size of query data (", DataSize, ") is incorrect: ", sizeof(QueryDataDuration), " (aka sizeof(QueryDataDuration)) is expected.");
                    break;

                default:
                    UNEXPECTED("Unexpected query type.");
            }
        }
    }